

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

ostream * testing::operator<<(ostream *os,TestPartResult *result)

{
  ostream *poVar1;
  size_t sVar2;
  char *pcVar3;
  char *__s;
  
  pcVar3 = (result->file_name_)._M_dataplus._M_p;
  if (pcVar3 == (char *)0x0 || (result->file_name_)._M_string_length == 0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar2 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,":",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)os,result->line_number_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  pcVar3 = "Non-fatal failure";
  if (result->type_ == kFatalFailure) {
    pcVar3 = "Fatal failure";
  }
  __s = "Success";
  if (result->type_ != kSuccess) {
    __s = pcVar3;
  }
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":\n",2);
  pcVar3 = (result->message_)._M_dataplus._M_p;
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const TestPartResult& result) {
  return os
      << result.file_name() << ":" << result.line_number() << ": "
      << (result.type() == TestPartResult::kSuccess ? "Success" :
          result.type() == TestPartResult::kFatalFailure ? "Fatal failure" :
          "Non-fatal failure") << ":\n"
      << result.message() << std::endl;
}